

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O0

void data_pipeline_1P(size_t L,uint w,PipeType type)

{
  char *__s;
  int in_EDX;
  uint in_ESI;
  Taskflow *in_RDI;
  Task test;
  Task datapipeline;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>_>
  pl;
  size_t j;
  Taskflow taskflow;
  size_t N;
  vector<int,_std::allocator<int>_> source;
  size_t maxN;
  Executor executor;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb90;
  anon_class_16_2_26634897 *pred;
  Taskflow *in_stack_fffffffffffffba0;
  size_type in_stack_fffffffffffffba8;
  Executor *this;
  Taskflow *in_stack_fffffffffffffbb0;
  Executor *this_00;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>_>
  *object;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined1 local_3f1 [17];
  DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>
  *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>_>
  *in_stack_fffffffffffffc30;
  Task local_3b0;
  allocator<char> local_3a1;
  string local_3a0 [24];
  undefined8 in_stack_fffffffffffffc78;
  size_t in_stack_fffffffffffffc80;
  Task in_stack_fffffffffffffc88;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>_>
  local_278;
  ulong local_1a8;
  int *local_1a0;
  int *local_198;
  undefined1 local_189 [377];
  int local_10;
  Taskflow *local_8;
  
  __s = (char *)(ulong)in_ESI;
  object = (DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>_>
            *)(local_189 + 0x31);
  local_10 = in_EDX;
  local_8 = in_RDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb90._M_current,
             in_stack_fffffffffffffb88._M_current);
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc88._node,in_stack_fffffffffffffc80,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc78);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1260d5);
  local_189._25_8_ = 100;
  this_00 = (Executor *)local_189;
  std::allocator<int>::allocator((allocator<int> *)0x1260f3);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffba8,(allocator_type *)in_stack_fffffffffffffba0);
  std::allocator<int>::~allocator((allocator<int> *)0x126119);
  local_198 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               (in_stack_fffffffffffffb88._M_current);
  local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               (in_stack_fffffffffffffb88._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,0);
  for (local_1a8 = 0; local_1a8 < 0x65; local_1a8 = local_1a8 + 1) {
    if (local_10 == 2) {
      tf::Taskflow::Taskflow(in_stack_fffffffffffffbb0);
      local_278._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      in_stack_fffffffffffffbb0 = local_8;
      tf::
      make_data_pipe<tf::Pipeflow&,void,data_pipeline_1P(unsigned_long,unsigned_int,tf::PipeType)::__0>
                ((PipeType)((ulong)in_stack_fffffffffffffb90._M_current >> 0x20),
                 (callable_t *)in_stack_fffffffffffffb88._M_current);
      tf::
      DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:30:77)>_>
      ::DataPipeline(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      tf::FlowBuilder::
      composed_of<tf::DataPipeline<tf::DataPipe<tf::Pipeflow&,void,data_pipeline_1P(unsigned_long,unsigned_int,tf::PipeType)::__0>>>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),object
                );
      this = (Executor *)&local_3a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
                 (allocator<char> *)this_00);
      in_stack_fffffffffffffba0 =
           (Taskflow *)
           tf::Task::name((Task *)in_stack_fffffffffffffb90._M_current,
                          (string *)in_stack_fffffffffffffb88._M_current);
      tf::Task::Task((Task *)&stack0xfffffffffffffc88,(Task *)in_stack_fffffffffffffba0);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator(&local_3a1);
      in_stack_fffffffffffffc30 = &local_278;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:42:36),_nullptr>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (anon_class_24_3_39ce40af *)object);
      pred = (anon_class_16_2_26634897 *)local_3f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
                 (allocator<char> *)this_00);
      in_stack_fffffffffffffb90._M_current =
           (int *)tf::Task::name(in_stack_fffffffffffffb90._M_current,
                                 in_stack_fffffffffffffb88._M_current);
      tf::Task::Task(&local_3b0,(Task *)in_stack_fffffffffffffb90._M_current);
      std::__cxx11::string::~string((string *)(local_3f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_3f1);
      tf::Task::precede<tf::Task&>
                ((Task *)in_stack_fffffffffffffb90._M_current,
                 (Task *)in_stack_fffffffffffffb88._M_current);
      in_stack_fffffffffffffbd8 = 3;
      tf::Executor::run_until<data_pipeline_1P(unsigned_long,unsigned_int,tf::PipeType)::__2>
                (this,in_stack_fffffffffffffba0,pred);
      std::future<void>::get((future<void> *)in_stack_fffffffffffffba0);
      tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffb90._M_current);
      tf::
      DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:30:77)>_>
      ::~DataPipeline((DataPipeline<tf::DataPipe<tf::Pipeflow_&,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:30:77)>_>
                       *)in_stack_fffffffffffffb90._M_current);
      tf::Taskflow::~Taskflow((Taskflow *)in_stack_fffffffffffffb90._M_current);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba0);
  tf::Executor::~Executor(this_00);
  return;
}

Assistant:

void data_pipeline_1P(size_t L, unsigned w, tf::PipeType type) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);

  // iterate different data amount (1, 2, 3, 4, 5, ... 1000000)
  for (size_t N = 0; N <= maxN; N++) {

    // serial direction
    if (type == tf::PipeType::SERIAL) {
      tf::Taskflow taskflow;
      size_t j = 0;
      tf::DataPipeline pl (L, tf::make_data_pipe<tf::Pipeflow&, void>(type, [L, N, &j, &source](auto& pf) mutable {
        if (j == N) {
          pf.stop();
          return;
        }
        REQUIRE(j == source[j]);
        REQUIRE(pf.token() % L == pf.line());
        j++;
      }));

      auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");

      auto test = taskflow.emplace([&](){
        REQUIRE(j == N);
        REQUIRE(pl.num_tokens() == N);
      }).name("test");

      datapipeline.precede(test);

      executor.run_until(taskflow, [counter=3, j]() mutable{
        j = 0;
        return counter --== 0;
      }).get();
    }
  }
}